

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::evaluateConditional(QMakeEvaluator *this,QStringView cond,QString *where,int line)

{
  long lVar1;
  QStringView contents;
  bool bVar2;
  ProFile *this_00;
  SubGrammar in_EDX;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  Location LVar3;
  ProFile *pro;
  VisitReturn ret;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  QMakeEvaluator *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QMakeParser *in_stack_ffffffffffffff98;
  VisitReturn local_60;
  storage_type_conflict *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = ReturnFalse;
  uVar4 = 1;
  contents.m_data = in_stack_ffffffffffffffb8;
  contents.m_size = in_RDI;
  this_00 = QMakeParser::parsedProBlock
                      (in_stack_ffffffffffffff98,contents,(int)((ulong)in_RDI >> 0x20),
                       in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       in_EDX);
  bVar2 = ProFile::isOk(this_00);
  if (bVar2) {
    QStack<QMakeEvaluator::Location>::push
              ((QStack<QMakeEvaluator::Location> *)in_stack_ffffffffffffff70,
               (Location *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
    ProFile::tokPtr((ProFile *)0x2fea15);
    local_60 = visitProBlock(in_stack_ffffffffffffff70,
                             (ProFile *)CONCAT44(in_stack_ffffffffffffff6c,uVar4),(ushort *)0x2fea27
                            );
    LVar3 = QStack<QMakeEvaluator::Location>::pop
                      ((QStack<QMakeEvaluator::Location> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    *(ProFile **)(in_RDI + 0x10) = LVar3.pro;
    *(ushort *)(in_RDI + 0x18) = LVar3.line;
  }
  ProFile::deref((ProFile *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_60;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateConditional(
        QStringView cond, const QString &where, int line)
{
    VisitReturn ret = ReturnFalse;
    ProFile *pro = m_parser->parsedProBlock(cond, 0, where, line, QMakeParser::TestGrammar);
    if (pro->isOk()) {
        m_locationStack.push(m_current);
        ret = visitProBlock(pro, pro->tokPtr());
        m_current = m_locationStack.pop();
    }
    pro->deref();
    return ret;
}